

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_data.hpp
# Opt level: O1

void __thiscall boost::detail::thread_data_base::thread_data_base(thread_data_base *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_enable_shared_from_this<boost::detail::thread_data_base>).weak_this_.px =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<boost::detail::thread_data_base>).weak_this_.pn.pi_ =
       (sp_counted_base *)0x0;
  this->_vptr_thread_data_base = (_func_int **)&PTR__thread_data_base_001ce590;
  (this->self).px = (element_type *)0x0;
  (this->self).pn.pi_ = (sp_counted_base *)0x0;
  this->thread_handle = 0;
  mutex::mutex(&this->data_mutex);
  condition_variable::condition_variable(&this->done_condition);
  mutex::mutex(&this->sleep_mutex);
  condition_variable::condition_variable(&this->sleep_condition);
  this->done = false;
  this->join_started = false;
  this->joined = false;
  this->thread_exit_callbacks = (thread_exit_callback_node *)0x0;
  p_Var1 = &(this->tss_data)._M_t._M_impl.super__Rb_tree_header;
  (this->tss_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->tss_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->tss_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->tss_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->tss_data)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->cond_mutex = (pthread_mutex_t *)0x0;
  this->current_cond = (pthread_cond_t *)0x0;
  (this->notify).
  super__Vector_base<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->notify).
  super__Vector_base<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->notify).
  super__Vector_base<std::pair<boost::condition_variable_*,_boost::mutex_*>,_std::allocator<std::pair<boost::condition_variable_*,_boost::mutex_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->async_states_).
  super__Vector_base<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->async_states_).
  super__Vector_base<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->async_states_).
  super__Vector_base<boost::shared_ptr<boost::detail::shared_state_base>,_std::allocator<boost::shared_ptr<boost::detail::shared_state_base>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->interrupt_enabled = true;
  this->interrupt_requested = false;
  return;
}

Assistant:

thread_data_base():
                thread_handle(0),
                done(false),join_started(false),joined(false),
                thread_exit_callbacks(0),
//#if defined BOOST_THREAD_PROVIDES_INTERRUPTIONS
                cond_mutex(0),
                current_cond(0),
//#endif
                notify(),
                async_states_()
//#if defined BOOST_THREAD_PROVIDES_INTERRUPTIONS
                , interrupt_enabled(true)
                , interrupt_requested(false)
//#endif
            {}